

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::
ValidationErrorTest_Edition2024DefaultVisibilityFromOther_Test::TestBody
          (ValidationErrorTest_Edition2024DefaultVisibilityFromOther_Test *this)

{
  string_view expected_errors;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  string_view local_70;
  string_view local_60;
  string_view local_50;
  string_view local_40;
  string_view local_30;
  string_view local_20;
  ValidationErrorTest_Edition2024DefaultVisibilityFromOther_Test *local_10;
  ValidationErrorTest_Edition2024DefaultVisibilityFromOther_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"vis.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,
             "\n        edition = \"2024\";\n        package vis.test;\n\n        message TopLevelMessage {\n          message NestedMessage {\n          }\n        }\n        "
            );
  ValidationErrorTest::ParseAndBuildFile(&this->super_ValidationErrorTest,local_20,local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"good_importer.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,
             "\n        edition = \"2024\";\n        import \"vis.proto\";\n\n        message GoodImport {\n          vis.test.TopLevelMessage foo = 1;\n        }\n        "
            );
  ValidationErrorTest::ParseAndBuildFile(&this->super_ValidationErrorTest,local_40,local_50);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_60,"bad_importer.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_70,
             "\n        edition = \"2024\";\n        import \"vis.proto\";\n\n        message BadImport {\n          vis.test.TopLevelMessage.NestedMessage foo = 1;\n        }\n        "
            );
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_80,
             "bad_importer.proto: BadImport.foo: TYPE: Symbol \"vis.test.TopLevelMessage.NestedMessage\", defined in \"vis.proto\"  is not visible from \"bad_importer.proto\". It defaulted to local from file-level \'option features.default_symbol_visibility = \'EXPORT_TOP_LEVEL\'; and cannot be accessed outside its own file\n"
            );
  expected_errors._M_str = local_80._M_str;
  expected_errors._M_len = local_80._M_len;
  ValidationErrorTest::ParseAndBuildFileWithErrorSubstr
            (&this->super_ValidationErrorTest,local_60,local_70,expected_errors);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, Edition2024DefaultVisibilityFromOther) {
  ParseAndBuildFile("vis.proto", R"schema(
        edition = "2024";
        package vis.test;

        message TopLevelMessage {
          message NestedMessage {
          }
        }
        )schema");

  ParseAndBuildFile("good_importer.proto", R"schema(
        edition = "2024";
        import "vis.proto";

        message GoodImport {
          vis.test.TopLevelMessage foo = 1;
        }
        )schema");

  ParseAndBuildFileWithErrorSubstr(
      "bad_importer.proto", R"schema(
        edition = "2024";
        import "vis.proto";

        message BadImport {
          vis.test.TopLevelMessage.NestedMessage foo = 1;
        }
        )schema",

      "bad_importer.proto: BadImport.foo: TYPE: Symbol "
      "\"vis.test.TopLevelMessage.NestedMessage\", defined in \"vis.proto\"  "
      "is not visible from \"bad_importer.proto\". It defaulted to local from "
      "file-level 'option features.default_symbol_visibility = "
      "'EXPORT_TOP_LEVEL'; and cannot be accessed outside its own file\n");
}